

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.h
# Opt level: O3

void pzgeom::TPZGeoQuad::X<double>(TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  int j;
  long lVar4;
  ulong uVar5;
  double extraout_XMM0_Qa;
  TPZFNMatrix<4,_double> phi;
  TPZFNMatrix<8,_double> dphi;
  TPZFMatrix<double> local_1c0;
  double local_130 [5];
  TPZFMatrix<double> local_108;
  double adStack_78 [9];
  
  local_1c0.fElem = local_130;
  local_1c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 4;
  local_1c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_1c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01878f70;
  local_1c0.fSize = 4;
  local_1c0.fGiven = local_1c0.fElem;
  TPZVec<int>::TPZVec(&local_1c0.fPivot.super_TPZVec<int>,0);
  local_1c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1c0.fPivot.super_TPZVec<int>.fStore = local_1c0.fPivot.fExtAlloc;
  local_1c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1c0.fWork.fStore = (double *)0x0;
  local_1c0.fWork.fNElements = 0;
  local_1c0.fWork.fNAlloc = 0;
  local_1c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01878c80;
  local_108.fElem = adStack_78;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 4;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01879930;
  local_108.fSize = 8;
  local_108.fGiven = local_108.fElem;
  TPZVec<int>::TPZVec(&local_108.fPivot.super_TPZVec<int>,0);
  local_108.fPivot.super_TPZVec<int>.fStore = local_108.fPivot.fExtAlloc;
  local_108.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_108.fPivot.super_TPZVec<int>.fNElements = 0;
  local_108.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_108.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_108.fWork.fStore = (double *)0x0;
  local_108.fWork.fNElements = 0;
  local_108.fWork.fNAlloc = 0;
  local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01879640;
  pztopology::TPZQuadrilateral::TShape<double>(loc,&local_1c0,&local_108);
  uVar2 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if (0 < (int)uVar2) {
    pdVar3 = x->fStore;
    uVar5 = 0;
    do {
      pdVar3[uVar5] = 0.0;
      lVar4 = 0;
      do {
        if ((local_1c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar4) ||
           (local_1c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar1 = local_1c0.fElem[lVar4];
        (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(nodes,uVar5,lVar4);
        pdVar3 = x->fStore;
        pdVar3[uVar5] = dVar1 * extraout_XMM0_Qa + pdVar3[uVar5];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uVar2 & 0x7fffffff));
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_108,&PTR_PTR_018798f8);
  TPZFMatrix<double>::~TPZFMatrix(&local_1c0,&PTR_PTR_01878f38);
  return;
}

Assistant:

inline void TPZGeoQuad::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<4,T> phi(NNodes,1);
        TPZFNMatrix<8,T> dphi(2,NNodes);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < 4; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
        
    }